

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256CbcIvEmpty_Test::~CryptoUtil_EncryptAes256CbcIvEmpty_Test
          (CryptoUtil_EncryptAes256CbcIvEmpty_Test *this)

{
  CryptoUtil_EncryptAes256CbcIvEmpty_Test *this_local;
  
  ~CryptoUtil_EncryptAes256CbcIvEmpty_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256CbcIvEmpty) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    std::vector<uint8_t> iv;
    ByteData byte_data = CryptoUtil::EncryptAes256Cbc(
        key.GetBytes(), iv, "aiueoaiueoaiueoaiueoaiueoaiueoai");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256Cbc error.");
    return;
  }
  ASSERT_TRUE(false);
}